

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_dr_wav_get_cursor_in_pcm_frames(ma_dr_wav *pWav,ma_uint64 *pCursor)

{
  ma_uint64 *pCursor_local;
  ma_dr_wav *pWav_local;
  ma_result local_4;
  
  if (pCursor == (ma_uint64 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *pCursor = 0;
    if (pWav == (ma_dr_wav *)0x0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      *pCursor = pWav->readCursorInPCMFrames;
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_dr_wav_get_cursor_in_pcm_frames(ma_dr_wav* pWav, ma_uint64* pCursor)
{
    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }
    *pCursor = 0;
    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }
    *pCursor = pWav->readCursorInPCMFrames;
    return MA_SUCCESS;
}